

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O1

int __thiscall
tetgenmesh::scoutsubface(tetgenmesh *this,face *searchsh,triface *searchtet,int shflag)

{
  tetrahedron *pppdVar1;
  uint uVar2;
  uint uVar3;
  tetrahedron endpt;
  double *pdVar4;
  int i;
  int iVar5;
  interresult iVar6;
  tetrahedron *pppdVar7;
  tetrahedron ppdVar8;
  long lVar9;
  ulong uVar10;
  int *piVar11;
  
  ppdVar8 = searchsh->sh[sorgpivot[searchsh->shver]];
  endpt = searchsh->sh[sdestpivot[searchsh->shver]];
  pdVar4 = ppdVar8[this->point2simindex];
  searchtet->ver = (uint)pdVar4 & 0xf;
  pppdVar7 = (tetrahedron *)((ulong)pdVar4 & 0xfffffffffffffff0);
  searchtet->tet = pppdVar7;
  if (pppdVar7[4] == ppdVar8) {
    iVar5 = 0xb;
  }
  else if (pppdVar7[5] == ppdVar8) {
    iVar5 = 3;
  }
  else {
    iVar5 = 7;
    if (pppdVar7[6] != ppdVar8) {
      iVar5 = 0;
    }
  }
  searchtet->ver = iVar5;
  iVar6 = finddirection(this,searchtet,(point)endpt);
  if (iVar6 == ACROSSVERT) {
    if (searchtet->tet[destpivot[searchtet->ver]] != endpt) {
      if (shflag == 0) {
LAB_0012d678:
        puts("Please report this bug to Hang.Si@wias-berlin.de. Include");
        puts("  the message above, your input data set, and the exact");
        puts("  command line you used to run this program, thank you.");
        exit(2);
      }
      report_selfint_edge(this,(point)ppdVar8,(point)endpt,searchsh,searchtet,ACROSSVERT);
    }
    piVar11 = &searchtet->ver;
    pppdVar7 = searchtet->tet;
    do {
      uVar2 = *piVar11;
      if (pppdVar7[apexpivot[(int)uVar2]] == searchsh->sh[sapexpivot[searchsh->shver]]) {
        ppdVar8 = pppdVar7[9];
        if (ppdVar8 != (tetrahedron)0x0) {
          if (ppdVar8[uVar2 & 3] != (double *)0x0) goto LAB_0012d678;
          if (ppdVar8 != (tetrahedron)0x0) goto LAB_0012d55e;
        }
        ppdVar8 = (tetrahedron)memorypool::alloc(this->tet2subpool);
        pppdVar7[9] = ppdVar8;
        lVar9 = 0;
        do {
          pppdVar7[9][lVar9] = (double *)0x0;
          lVar9 = lVar9 + 1;
        } while (lVar9 != 4);
LAB_0012d55e:
        uVar3 = searchsh->shver;
        uVar10 = (ulong)((uVar2 & 3) << 3);
        *(ulong *)((long)pppdVar7[9] + uVar10) =
             (long)tsbondtbl[(int)uVar2][(int)uVar3] | (ulong)searchsh->sh;
        searchsh->sh[(ulong)(uVar3 & 1) + 9] =
             (shellface)((long)stbondtbl[(int)uVar2][(int)uVar3] | (ulong)pppdVar7);
        uVar10 = *(ulong *)((long)pppdVar7 + uVar10);
        pppdVar7 = (tetrahedron *)(uVar10 & 0xfffffffffffffff0);
        uVar2 = fsymtbl[(int)uVar2][(uint)uVar10 & 0xf];
        searchsh->shver = uVar3 ^ 1;
        if (pppdVar7[9] == (tetrahedron)0x0) {
          ppdVar8 = (tetrahedron)memorypool::alloc(this->tet2subpool);
          pppdVar7[9] = ppdVar8;
          lVar9 = 0;
          do {
            pppdVar7[9][lVar9] = (double *)0x0;
            lVar9 = lVar9 + 1;
          } while (lVar9 != 4);
        }
        uVar3 = searchsh->shver;
        pppdVar7[9][uVar2 & 3] =
             (double *)((long)tsbondtbl[(int)uVar2][(int)uVar3] | (ulong)searchsh->sh);
        searchsh->sh[(ulong)(uVar3 & 1) + 9] =
             (shellface)((long)stbondtbl[(int)uVar2][(int)uVar3] | (ulong)pppdVar7);
        searchtet->tet = pppdVar7;
        searchtet->ver = uVar2;
        return 1;
      }
      pppdVar1 = pppdVar7 + facepivot1[(int)uVar2];
      pppdVar7 = (tetrahedron *)((ulong)*pppdVar1 & 0xfffffffffffffff0);
      piVar11 = facepivot2[(int)uVar2] + ((uint)*pppdVar1 & 0xf);
    } while (searchtet->tet != pppdVar7);
  }
  return 0;
}

Assistant:

int tetgenmesh::scoutsubface(face* searchsh, triface* searchtet, int shflag)
{
  point pa = sorg(*searchsh);
  point pb = sdest(*searchsh);

  // Get a tet whose origin is a.
  point2tetorg(pa, *searchtet);
  // Search the edge [a,b].
  enum interresult dir = finddirection(searchtet, pb);
  if (dir == ACROSSVERT) {
    // Check validity of a PLC.
    if (dest(*searchtet) != pb) {
	  if (shflag) {
        // A vertex lies on the search edge. 
	    report_selfint_edge(pa, pb, searchsh, searchtet, dir);
	  } else {
	    terminatetetgen(this, 2);
	  }
    }
	int t1ver;
    // The edge exists. Check if the face exists.
    point pc = sapex(*searchsh);
    // Searchtet holds edge [a,b]. Search a face with apex c.
    triface spintet = *searchtet;
    while (1) {
      if (apex(spintet) == pc) {
        // Found a face matching to 'searchsh'!
        if (!issubface(spintet)) {
          // Insert 'searchsh'.
          tsbond(spintet, *searchsh);
          fsymself(spintet);
          sesymself(*searchsh);
          tsbond(spintet, *searchsh);
          *searchtet = spintet;
          return 1; 
        } else {
          terminatetetgen(this, 2);
        }
      }
      fnextself(spintet);
      if (spintet.tet == searchtet->tet) break;
    }
  }

  return 0;
}